

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  undefined8 *puVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  undefined8 *puVar37;
  _func_int *p_Var38;
  int iVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  undefined8 *puVar43;
  long lVar44;
  int z;
  ulong uVar45;
  bool bVar46;
  Mat m;
  _func_int **local_b0;
  Mat m_1;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined3 uVar14;
  undefined2 uVar16;
  
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar18 = bottom_blob->d;
  uVar41 = bottom_blob->c;
  m.d = bottom_blob->d;
  m.c = bottom_blob->c;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      p_Var38 = this->_vptr_Padding_x86[-3];
      uVar41 = *(uint *)(&this->field_0xd8 + (long)p_Var38) + m.w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var38);
      bVar46 = (uVar41 & 7) == 0;
      if ((bVar46 && (*(uint *)(&this->field_0xd8 + (long)p_Var38) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
        Mat::create(top_blob,(int)uVar41 >> 3,(m.elemsize >> 3) << bVar46 * '\x03',8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var38 = this->_vptr_Padding_x86[-3];
        uVar20 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xdc + (long)p_Var38) / 8,
                   uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                   uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20);
        return 0;
      }
      break;
    case 2:
      p_Var38 = this->_vptr_Padding_x86[-3];
      uVar41 = *(uint *)(&this->field_0xd0 + (long)p_Var38) + m.h * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var38);
      bVar46 = (uVar41 & 7) == 0;
      if ((bVar46 && (*(uint *)(&this->field_0xd0 + (long)p_Var38) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var38) +
                             *(int *)(&this->field_0xdc + (long)p_Var38),(int)uVar41 >> 3,
                    (m.elemsize >> 3) << bVar46 * '\x03',8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var38 = this->_vptr_Padding_x86[-3];
        uVar20 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xd4 + (long)p_Var38) / 8,
                   *(int *)(&this->field_0xd8 + (long)p_Var38),
                   *(int *)(&this->field_0xdc + (long)p_Var38),
                   uVar20 << 0x38 | uVar20 << 0x30 | uVar20 << 0x28 |
                   uVar20 << 0x20 | uVar20 << 0x18 | uVar20 << 0x10 | uVar20 << 8 | uVar20);
        return 0;
      }
      break;
    case 3:
      p_Var38 = this->_vptr_Padding_x86[-3];
      uVar24 = *(uint *)(&this->field_0xe8 + (long)p_Var38) + uVar41 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var38);
      bVar46 = (uVar24 & 7) == 0;
      if (bVar46 && (*(uint *)(&this->field_0xe8 + (long)p_Var38) & 7) == 0) {
        if ((uVar24 == uVar41 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0)) {
          uVar24 = (int)uVar24 >> 3;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var38) + m.w +
                               *(int *)(&this->field_0xdc + (long)p_Var38),
                      *(int *)(&this->field_0xd0 + (long)p_Var38) + m.h +
                      *(int *)(&this->field_0xd4 + (long)p_Var38),uVar24,
                      (m.elemsize >> 3) << bVar46 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          local_b0 = this->_vptr_Padding_x86;
          uVar20 = (long)*(int *)(&this->field_0xe8 + (long)local_b0[-3]) / -8;
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          uVar30 = uVar20 & 0xffffffff;
          for (uVar29 = 0; uVar29 != uVar24; uVar29 = uVar29 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar28 = (undefined8 *)(sVar1 * uVar29 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            p_Var38 = local_b0[-3];
            uVar19 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var38);
            uVar19 = uVar19 << 0x38 | uVar19 << 0x30 | uVar19 << 0x28 |
                     uVar19 << 0x20 | uVar19 << 0x18 | uVar19 << 0x10 | uVar19 << 8 | uVar19;
            uVar21 = (int)uVar20 + (int)uVar29;
            if ((int)uVar21 < 0 || (int)uVar41 <= (int)uVar21) {
              uVar21 = top_blob->d * (int)m.cstep;
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              for (uVar45 = 0; uVar21 != uVar45; uVar45 = uVar45 + 1) {
                *(ulong *)((long)pvVar3 + uVar45 * 8 + sVar1 * m.elemsize * uVar29) = uVar19;
              }
            }
            else {
              iVar18 = bottom_blob->w;
              lVar35 = (long)iVar18;
              iVar23 = bottom_blob->h;
              m_1.c = bottom_blob->d;
              pvVar3 = bottom_blob->data;
              uVar45 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar43 = (undefined8 *)(uVar21 * sVar1 * uVar45 + (long)pvVar3);
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (uVar45 * iVar23 * lVar35 + 0xf & 0xfffffffffffffff0) / uVar45;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar23 * lVar35;
              }
              iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              m_1.w = iVar18;
              if (iVar22 == 0) {
                m.data = puVar28;
                m_1.data = puVar43;
                m_1.elemsize = uVar45;
                m_1.h = iVar23;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var38),
                           *(int *)(&this->field_0xd4 + (long)p_Var38),
                           *(int *)(&this->field_0xd8 + (long)p_Var38),
                           *(int *)(&this->field_0xdc + (long)p_Var38),uVar19);
                local_b0 = this->_vptr_Padding_x86;
                p_Var38 = local_b0[-3];
                iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              }
              if (iVar22 == 1) {
                iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var38);
                iVar39 = 0;
                iVar32 = *(int *)(&this->field_0xd8 + (long)p_Var38);
                if (*(int *)(&this->field_0xd8 + (long)p_Var38) < 1) {
                  iVar32 = iVar39;
                }
                iVar42 = 0;
                if (0 < iVar18) {
                  iVar42 = iVar18;
                }
                iVar31 = *(int *)(&this->field_0xdc + (long)p_Var38);
                if (*(int *)(&this->field_0xdc + (long)p_Var38) < 1) {
                  iVar31 = iVar39;
                }
                iVar34 = *(int *)(&this->field_0xd0 + (long)p_Var38);
                if (*(int *)(&this->field_0xd0 + (long)p_Var38) < 1) {
                  iVar34 = 0;
                }
                lVar36 = sVar1 * uVar45 * uVar30;
                puVar33 = puVar28;
                for (; iVar40 = iVar32, iVar39 != iVar34; iVar39 = iVar39 + 1) {
                  while (iVar40 != 0) {
                    *puVar33 = *puVar43;
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                  for (lVar44 = 0; iVar40 = iVar31, iVar42 != (int)lVar44; lVar44 = lVar44 + 1) {
                    *puVar33 = *(undefined8 *)((long)pvVar3 + lVar44 * 8 + lVar36);
                    puVar33 = puVar33 + 1;
                  }
                  while (iVar40 != 0) {
                    *puVar33 = *(undefined8 *)((long)pvVar3 + lVar44 * 8 + lVar36 + -8);
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                }
                iVar42 = 0;
                iVar39 = 0;
                if (0 < m_1.w) {
                  iVar39 = m_1.w;
                }
                puVar37 = puVar43;
                iVar34 = 0;
                if (0 < iVar23) {
                  iVar34 = iVar23;
                }
                for (; iVar40 = iVar32, iVar42 != iVar34; iVar42 = iVar42 + 1) {
                  while (iVar40 != 0) {
                    *puVar33 = *puVar37;
                    puVar33 = puVar33 + 1;
                    iVar40 = iVar40 + -1;
                  }
                  lVar36 = 0;
                  for (lVar44 = 0; iVar39 != (int)lVar44; lVar44 = lVar44 + 1) {
                    puVar33[lVar44] = puVar37[lVar44];
                    lVar36 = lVar36 + -8;
                  }
                  puVar33 = (undefined8 *)((long)puVar33 - lVar36);
                  iVar40 = iVar31;
                  while (bVar46 = iVar40 != 0, iVar40 = iVar40 + -1, bVar46) {
                    *puVar33 = puVar37[lVar44 + -1];
                    puVar33 = puVar33 + 1;
                  }
                  puVar37 = (undefined8 *)((long)puVar37 - lVar36);
                }
                puVar37 = puVar37 + -(long)m_1.w;
                iVar42 = 0;
                if (iVar22 < 1) {
                  iVar22 = 0;
                  iVar42 = 0;
                }
                for (; iVar34 = iVar32, iVar42 != iVar22; iVar42 = iVar42 + 1) {
                  while (iVar34 != 0) {
                    *puVar33 = *puVar37;
                    puVar33 = puVar33 + 1;
                    iVar34 = iVar34 + -1;
                  }
                  for (lVar36 = 0; iVar34 = iVar31, iVar39 != (int)lVar36; lVar36 = lVar36 + 1) {
                    *puVar33 = puVar37[lVar36];
                    puVar33 = puVar33 + 1;
                  }
                  while (iVar34 != 0) {
                    *puVar33 = puVar37[lVar36 + -1];
                    puVar33 = puVar33 + 1;
                    iVar34 = iVar34 + -1;
                  }
                }
                p_Var38 = local_b0[-3];
                iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var38);
              }
              if (iVar22 == 2) {
                iVar22 = *(int *)(&this->field_0xd0 + (long)p_Var38);
                uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var38);
                lVar36 = (long)(int)uVar21;
                uVar26 = 0;
                uVar19 = 0;
                if (0 < (int)uVar21) {
                  uVar19 = (ulong)uVar21;
                }
                iVar32 = 0;
                if (0 < iVar18) {
                  iVar32 = iVar18;
                }
                uVar27 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var38);
                if ((int)*(uint *)(&this->field_0xdc + (long)p_Var38) < 1) {
                  uVar27 = uVar26;
                }
                iVar39 = iVar22;
                if (iVar22 < 1) {
                  iVar39 = 0;
                }
                puVar43 = puVar43 + iVar22 * iVar18;
                iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var38);
                lVar44 = (long)pvVar3 +
                         sVar1 * uVar45 * uVar30 + lVar36 * 8 + (long)(iVar22 * iVar18) * 8;
                for (; (int)uVar26 != iVar39; uVar26 = (ulong)((int)uVar26 + 1)) {
                  for (lVar25 = 0; -lVar25 != uVar19; lVar25 = lVar25 + -1) {
                    *puVar28 = *(undefined8 *)(lVar44 + lVar25 * 8);
                    puVar28 = puVar28 + 1;
                  }
                  puVar33 = puVar43;
                  for (iVar22 = 0; iVar22 != iVar32; iVar22 = iVar22 + 1) {
                    uVar2 = *puVar33;
                    puVar33 = puVar33 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar25 = 0; -lVar25 != uVar27; lVar25 = lVar25 + -1) {
                    *puVar28 = puVar33[lVar25 + -2];
                    puVar28 = puVar28 + 1;
                  }
                  puVar43 = puVar43 + -lVar35;
                  lVar44 = lVar44 + lVar35 * -8;
                }
                iVar39 = 0;
                iVar22 = 0;
                if (0 < iVar23) {
                  iVar22 = iVar23;
                }
                for (; iVar39 != iVar22; iVar39 = iVar39 + 1) {
                  for (lVar44 = 0; -lVar44 != uVar19; lVar44 = lVar44 + -1) {
                    *puVar28 = puVar43[lVar36 + lVar44];
                    puVar28 = puVar28 + 1;
                  }
                  for (iVar23 = 0; iVar23 != iVar32; iVar23 = iVar23 + 1) {
                    uVar2 = *puVar43;
                    puVar43 = puVar43 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar44 = 0; -lVar44 != uVar27; lVar44 = lVar44 + -1) {
                    *puVar28 = puVar43[lVar44 + -2];
                    puVar28 = puVar28 + 1;
                  }
                }
                puVar33 = puVar43 + -(long)(iVar18 * 2);
                iVar23 = 0;
                if (iVar42 < 1) {
                  iVar42 = iVar23;
                }
                puVar43 = puVar43 + (lVar36 - iVar18 * 2);
                for (; iVar23 != iVar42; iVar23 = iVar23 + 1) {
                  for (lVar36 = 0; -lVar36 != uVar19; lVar36 = lVar36 + -1) {
                    *puVar28 = puVar43[lVar36];
                    puVar28 = puVar28 + 1;
                  }
                  puVar37 = puVar33;
                  for (iVar18 = 0; iVar18 != iVar32; iVar18 = iVar18 + 1) {
                    uVar2 = *puVar37;
                    puVar37 = puVar37 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar36 = 0; -lVar36 != uVar27; lVar36 = lVar36 + -1) {
                    *puVar28 = puVar37[lVar36 + -2];
                    puVar28 = puVar28 + 1;
                  }
                  puVar33 = puVar33 + -lVar35;
                  puVar43 = puVar43 + -lVar35;
                }
              }
            }
            uVar30 = (ulong)((int)uVar30 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      p_Var38 = this->_vptr_Padding_x86[-3];
      if (*(int *)(&this->field_0xe0 + (long)p_Var38) == 0) {
        uVar24 = *(int *)(&this->field_0xe8 + (long)p_Var38) + iVar18 +
                 *(int *)(&this->field_0xec + (long)p_Var38);
        uVar20 = (ulong)uVar24;
        Mat::create(top_blob,m.w + *(int *)(&this->field_0xd8 + (long)p_Var38) +
                             *(int *)(&this->field_0xdc + (long)p_Var38),
                    m.h + *(int *)(&this->field_0xd0 + (long)p_Var38) +
                    *(int *)(&this->field_0xd4 + (long)p_Var38),uVar24,uVar41,m.elemsize,8,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar24 < 1) {
          uVar20 = 0;
        }
        uVar29 = (ulong)uVar41;
        if ((int)uVar41 < 1) {
          uVar29 = 0;
        }
        for (uVar30 = 0; uVar30 != uVar29; uVar30 = uVar30 + 1) {
          uVar19 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
          uVar19 = uVar19 << 0x38 | uVar19 << 0x30 | uVar19 << 0x28 |
                   uVar19 << 0x20 | uVar19 << 0x18 | uVar19 << 0x10 | uVar19 << 8 | uVar19;
          for (uVar45 = 0; uVar45 != uVar20; uVar45 = uVar45 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar35 = top_blob->cstep * uVar30;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar45 * m.elemsize * m.cstep + lVar35 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            p_Var38 = this->_vptr_Padding_x86[-3];
            uVar41 = (int)uVar45 - *(int *)(&this->field_0xe8 + (long)p_Var38);
            if ((int)uVar41 < 0 || iVar18 <= (int)uVar41) {
              uVar26 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar26 = 0;
              }
              for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar27 * 8 + m.elemsize * ((long)m.h * uVar45 * (long)m.w + lVar35)) =
                     uVar19;
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 m_1.cstep * m_1.elemsize * (ulong)uVar41 +
                                 bottom_blob->cstep * uVar30 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var38),
                         *(int *)(&this->field_0xd4 + (long)p_Var38),
                         *(int *)(&this->field_0xd8 + (long)p_Var38),
                         *(int *)(&this->field_0xdc + (long)p_Var38),uVar19);
            }
          }
        }
        return 0;
      }
    }
  }
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + 1;
    UNLOCK();
  }
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar4 = opt->flush_denormals;
    uVar5 = opt->use_local_pool_allocator;
    uVar7 = opt->use_shader_local_memory;
    uVar9 = opt->use_cooperative_matrix;
    uVar11 = opt->use_winograd23_convolution;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar6 = CONCAT31(uVar8,uVar5);
    uVar2._0_1_ = opt->use_winograd43_convolution;
    uVar2._1_1_ = opt->use_winograd63_convolution;
    uVar2._2_1_ = opt->use_reserved_6;
    uVar2._3_1_ = opt->use_reserved_7;
    uVar12 = opt->use_reserved_8;
    uVar13 = opt->use_reserved_9;
    uVar15 = opt->use_reserved_10;
    uVar17 = opt->use_reserved_11;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar2._4_4_ = CONCAT31(uVar14,uVar12);
    m_1.c = (int)uVar2;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar4;
    m_1.d = uVar6;
    m_1._60_4_ = uVar2._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar18 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),&m,
                            top_blob,opt);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}